

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputBuffer.cpp
# Opt level: O2

uint __thiscall antlr::InputBuffer::mark(InputBuffer *this)

{
  syncConsume(this);
  this->nMarkers = this->nMarkers + 1;
  return this->markerOffset;
}

Assistant:

unsigned int InputBuffer::mark()
{
	syncConsume();
	nMarkers++;
	return markerOffset;
}